

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::AssertSnapEquiv
               (TopLevelCommonBodyResolveInfo *fbInfo1,TopLevelCommonBodyResolveInfo *fbInfo2,
               TTDCompareMap *compareMap)

{
  bool bVar1;
  uint local_24;
  uint32 i;
  TTDCompareMap *compareMap_local;
  TopLevelCommonBodyResolveInfo *fbInfo2_local;
  TopLevelCommonBodyResolveInfo *fbInfo1_local;
  
  TTDCompareMap::DiagnosticAssert
            (compareMap,fbInfo1->ScriptContextLogId == fbInfo2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->TopLevelBodyCtr == fbInfo2->TopLevelBodyCtr);
  bVar1 = TTStringEQForDiagnostics(&fbInfo1->FunctionName,&fbInfo2->FunctionName);
  TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->ModuleId == fbInfo2->ModuleId);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->SourceContextId == fbInfo2->SourceContextId);
  bVar1 = TTStringEQForDiagnostics(&fbInfo1->SourceUri,&fbInfo2->SourceUri);
  TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
  TTDCompareMap::DiagnosticAssert(compareMap,(fbInfo1->IsUtf8 & 1U) == (fbInfo2->IsUtf8 & 1U));
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->ByteLength == fbInfo2->ByteLength);
  for (local_24 = 0; local_24 < fbInfo1->ByteLength; local_24 = local_24 + 1) {
    TTDCompareMap::DiagnosticAssert
              (compareMap,fbInfo1->SourceBuffer[local_24] == fbInfo2->SourceBuffer[local_24]);
  }
  AssertSnapEquiv(&fbInfo1->ScopeChainInfo,&fbInfo2->ScopeChainInfo,compareMap);
  return;
}

Assistant:

void AssertSnapEquiv(const TopLevelCommonBodyResolveInfo* fbInfo1, const TopLevelCommonBodyResolveInfo* fbInfo2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(fbInfo1->ScriptContextLogId == fbInfo2->ScriptContextLogId);
            compareMap.DiagnosticAssert(fbInfo1->TopLevelBodyCtr == fbInfo2->TopLevelBodyCtr);
            compareMap.DiagnosticAssert(TTStringEQForDiagnostics(fbInfo1->FunctionName, fbInfo2->FunctionName));

            compareMap.DiagnosticAssert(fbInfo1->ModuleId == fbInfo2->ModuleId);
            compareMap.DiagnosticAssert(fbInfo1->SourceContextId == fbInfo2->SourceContextId);

            compareMap.DiagnosticAssert(TTStringEQForDiagnostics(fbInfo1->SourceUri, fbInfo2->SourceUri));

            compareMap.DiagnosticAssert(fbInfo1->IsUtf8 == fbInfo2->IsUtf8);
            compareMap.DiagnosticAssert(fbInfo1->ByteLength == fbInfo2->ByteLength);

            for(uint32 i = 0; i < fbInfo1->ByteLength; ++i)
            {
                compareMap.DiagnosticAssert(fbInfo1->SourceBuffer[i] == fbInfo2->SourceBuffer[i]);
            }

            AssertSnapEquiv(fbInfo1->ScopeChainInfo, fbInfo2->ScopeChainInfo, compareMap);
        }